

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O3

int main(int argc,char **argv)

{
  khalfflag_t *pkVar1;
  byte bVar2;
  kArray *pkVar3;
  _func_kString_ptr_KonohaContext_ptr_kArray_ptr_char_ptr_size_t_int *p_Var4;
  _func_void_KonohaContext_ptr_kArray_ptr_void_ptr *p_Var5;
  _func_kbool_t_KonohaContext_ptr_kNameSpace_ptr_char_ptr_ptr_KTraceInfo_ptr *p_Var6;
  KModuleInfo *pKVar7;
  _func_void_KonohaContext_ptr_KBuffer_ptr_char_ptr_size_t *p_Var8;
  _func_int_char_ptr *p_Var9;
  KRuntimeContextVar *pKVar10;
  _func_int_char_ptr_varargs *p_Var11;
  _func_uintptr_t_KonohaContext_ptr_kObject_ptr *p_Var12;
  bool bVar13;
  char **ppcVar14;
  char cVar15;
  int iVar16;
  char *pcVar17;
  KonohaContext *kctx;
  size_t sVar18;
  kString *pkVar19;
  kNameSpace *pkVar20;
  kfileline_t kVar21;
  uintptr_t uVar22;
  PlatformApi *pPVar23;
  ulong uVar24;
  ktypeattr_t ty;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  KonohaFactory factory;
  ulong local_480;
  KBuffer local_478;
  kObject_conflict *local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  kObject_conflict *local_448;
  char **local_440;
  KClass *local_438;
  size_t local_430;
  long local_428;
  ulong local_420;
  KTraceInfo local_418;
  undefined1 local_400 [24];
  undefined8 local_3e8;
  undefined4 local_3e0;
  
  memset(local_400,0,0x3d0);
  pcVar17 = getenv("KONOHA_DEBUG");
  if (pcVar17 != (char *)0x0) {
    local_3e8 = 0x100000001;
    local_3e0 = 1;
  }
  KonohaFactory_SetDefaultFactory(local_400,PosixFactory,argc,argv);
  kctx = (KonohaContext *)KonohaFactory_CreateKonoha(local_400);
  local_418.baseStack = kctx->esp + 4;
  local_418.pline = 0;
  local_418.errorSymbol = 0;
  local_418.faultType = 0;
  do {
    while( true ) {
      while( true ) {
        local_478.m = (KGrowingArray *)((ulong)local_478.m & 0xffffffff00000000);
        iVar16 = getopt_long(argc,argv,"icqD:I:M:S:f:",long_options2,&local_478);
        if (iVar16 < 0x4d) break;
        if (iVar16 < 0x69) {
          if (iVar16 == 0x4d) {
            if ((_optarg != (char *)0x0) && (iVar16 = strcmp(_optarg,"OutputTest"), iVar16 == 0)) {
              pkVar1 = &kctx->stack->flag;
              *pkVar1 = *pkVar1 | 1;
              pPVar23 = kctx->platApi;
              pPVar23->verbose_debug = 0;
              pPVar23->verbose_sugar = 0;
              pPVar23->verbose_code = 0;
            }
          }
          else {
            if (iVar16 != 99) goto LAB_0010279d;
            pkVar1 = &kctx->stack->flag;
            *pkVar1 = *pkVar1 | 4;
          }
        }
        else if (iVar16 == 0x69) {
          interactive_flag = '\x01';
          pkVar1 = &kctx->stack->flag;
          *pkVar1 = *pkVar1 | 2;
        }
        else {
          if (iVar16 != 0x71) goto LAB_0010279d;
          fprintf(_stdout,"%s-%lu\n","3.0",0x1082b);
          (*kctx->platApi->exit_i)
                    (0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/exec/command/command.c"
                     ,0xaa);
        }
      }
      if (iVar16 < 0x44) break;
      if (iVar16 == 0x44) {
        CommandLine_Define(kctx,_optarg,&local_418);
      }
      else {
        if (iVar16 != 0x49) goto LAB_0010279d;
        CommandLine_Import(kctx,_optarg,&local_418);
      }
    }
  } while (iVar16 == 0x3f);
  if (iVar16 == -1) {
    local_428 = (long)_optind;
    uVar27 = argc - _optind;
    local_440 = argv + local_428;
    pkVar3 = kctx->stack->gcStack;
    local_430 = pkVar3->bytesize;
    local_478.m = (KGrowingArray *)0x5;
    local_438 = (*kctx->klib->KClass_Generics)
                          (kctx,*(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x30),0,1,
                           (kparamtype_t *)&local_478);
    local_448 = (*kctx->klib->new_kObject)(kctx,pkVar3,local_438,0);
    if (0 < (int)uVar27) {
      local_420 = (ulong)uVar27;
      uVar25 = 0;
      do {
        p_Var4 = kctx->klib->new_kString;
        p_Var5 = kctx->klib->kArray_Add;
        pcVar17 = local_440[uVar25];
        sVar18 = strlen(pcVar17);
        pkVar19 = (*p_Var4)(kctx,pkVar3,pcVar17,sVar18,1);
        (*p_Var5)(kctx,(kArray *)local_448,pkVar19);
        uVar25 = uVar25 + 1;
      } while (local_420 != uVar25);
    }
    ppcVar14 = local_440;
    uVar25 = local_430 >> 3;
    local_478.m = (KGrowingArray *)0x1056b9;
    local_478.pos = (size_t)local_438->typeId;
    local_468 = local_448;
    local_460 = 0;
    uStack_458 = 0;
    local_450 = 0;
    p_Var6 = kctx->klib->kNameSpace_LoadConstData;
    pkVar20 = (kNameSpace *)
              (*kctx->klib->Knull)
                        (kctx,*(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58));
    (*p_Var6)(kctx,pkVar20,(char **)&local_478,&local_418);
    (*kctx->klib->kArray_Clear)(kctx,pkVar3,uVar25);
    if ((int)local_428 < argc) {
      Konoha_LoadScript(kctx,*ppcVar14);
      if (interactive_flag != '\x01') goto LAB_00102c5c;
    }
    else {
      interactive_flag = '\x01';
      pkVar1 = &kctx->stack->flag;
      *pkVar1 = *pkVar1 | 2;
    }
    CommandLine_Import(kctx,"Konoha.Man",&local_418);
    (*kctx->platApi->printf_i)
              ("Konoha alpha 3.0 (%s) (%s, %lu, %s)\n","Rome","93e091e6",0x1082b,"Apr 27 2025");
    (*kctx->platApi->printf_i)
              ("[gcc %s]\n",
               "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
              );
    (*kctx->platApi->printf_i)("modules:");
    pPVar23 = kctx->platApi;
    pKVar7 = (pPVar23->ExecutionEngineModule).ExecutionEngineInfo;
    if ((pKVar7 != (KModuleInfo *)0x0) && (pKVar7->desc != (char *)0x0)) {
      (*pPVar23->printf_i)(" %s");
      pPVar23 = kctx->platApi;
    }
    pKVar7 = (pPVar23->GCModule).GCInfo;
    if ((pKVar7 != (KModuleInfo *)0x0) && (pKVar7->desc != (char *)0x0)) {
      (*pPVar23->printf_i)(" %s");
      pPVar23 = kctx->platApi;
    }
    pKVar7 = (pPVar23->ConsoleModule).ConsoleInfo;
    if ((pKVar7 != (KModuleInfo *)0x0) && (pKVar7->desc != (char *)0x0)) {
      (*pPVar23->printf_i)(" %s");
      pPVar23 = kctx->platApi;
    }
    pKVar7 = (pPVar23->EventModule).EventInfo;
    if ((pKVar7 != (KModuleInfo *)0x0) && (pKVar7->desc != (char *)0x0)) {
      (*pPVar23->printf_i)(" %s");
      pPVar23 = kctx->platApi;
    }
    pKVar7 = (pPVar23->I18NModule).I18NInfo;
    if ((pKVar7 != (KModuleInfo *)0x0) && (pKVar7->desc != (char *)0x0)) {
      (*pPVar23->printf_i)(" %s");
      pPVar23 = kctx->platApi;
    }
    (*pPVar23->printf_i)("\n");
    (*kctx->klib->KBuffer_Init)(&kctx->stack->cwb,&local_478);
    kVar21 = (*kctx->klib->KfileId)(kctx,"(shell)",7,3,0xfffffffe);
    local_480 = kVar21 | 1;
LAB_0010292c:
    pcVar17 = (*kctx->platApi->readline_i)(">>> ");
    bVar13 = true;
    if (pcVar17 == (char *)0x0) {
      lVar26 = 0;
    }
    else {
      uVar27 = 1;
      lVar26 = 0;
      do {
        if (1 < uVar27) {
          (*kctx->klib->KBuffer_Write)(kctx,&local_478,"\n",1);
        }
        p_Var8 = kctx->klib->KBuffer_Write;
        sVar18 = strlen(pcVar17);
        (*p_Var8)(kctx,&local_478,pcVar17,sVar18);
        free(pcVar17);
        pcVar17 = (*kctx->klib->KBuffer_text)(kctx,&local_478,0);
        uVar25 = (local_478.m)->bytesize - local_478.pos;
        if ((local_478.m)->bytesize == local_478.pos) {
          fflush(_stdout);
          goto LAB_00102ae7;
        }
        iVar16 = 0;
        uVar24 = 0;
        do {
          bVar2 = pcVar17[uVar24];
          if (((bVar2 == 0x28) || (bVar2 == 0x7b)) || (bVar2 == 0x5b)) {
            iVar16 = iVar16 + 1;
          }
          if (((bVar2 == 0x29) || (bVar2 == 0x7d)) || (bVar2 == 0x5d)) {
            iVar16 = iVar16 + -1;
          }
          if (((bVar2 - 0x22 < 0x3f) &&
              ((0x4000000000000021U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) != 0)) &&
             ((pcVar17[uVar24 + 1] == bVar2 && (pcVar17[uVar24 + 2] == bVar2)))) {
            uVar24 = uVar24 + 2;
            if (uVar24 == 0) {
              __assert_fail("i > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/include/konoha3/libcode/minishell.h"
                            ,0x2e,"int CheckNode(const char *, size_t)");
            }
            while( true ) {
              if (uVar25 <= uVar24) goto LAB_00102a58;
              if ((((pcVar17[uVar24 - 1] != '\\') && (pcVar17[uVar24] == bVar2)) &&
                  (pcVar17[uVar24 + 1] == bVar2)) && (pcVar17[uVar24 + 2] == bVar2)) break;
              uVar24 = uVar24 + 1;
            }
            uVar24 = uVar24 + 2;
          }
          else {
            uVar24 = uVar24 + 1;
          }
        } while (uVar24 < uVar25);
        if (iVar16 < 1) {
          if (iVar16 < 0) {
            bVar13 = false;
            (*kctx->platApi->printf_i)("(Cancelled)...\n");
            goto LAB_00102a7f;
          }
          bVar13 = false;
          goto LAB_00102a9a;
        }
LAB_00102a58:
        lVar26 = lVar26 + 1;
        uVar27 = uVar27 + 1;
        pcVar17 = (*kctx->platApi->readline_i)("    ");
      } while (pcVar17 != (char *)0x0);
      bVar13 = true;
    }
LAB_00102a7f:
    (*kctx->klib->KBuffer_Free)(&local_478);
    if ((local_478.m)->bytesize != local_478.pos) {
LAB_00102a9a:
      p_Var9 = kctx->platApi->add_history_i;
      pcVar17 = (*kctx->klib->KBuffer_text)(kctx,&local_478,1);
      (*p_Var9)(pcVar17);
    }
    fflush(_stdout);
    if (!bVar13) {
LAB_00102ae7:
      if ((local_478.m)->bytesize != local_478.pos) {
        pcVar17 = (*kctx->klib->KBuffer_text)(kctx,&local_478,1);
        cVar15 = Konoha_Eval(kctx,pcVar17,local_480);
        local_480 = local_480 + lVar26 + 1;
        (*kctx->klib->KBuffer_Free)(&local_478);
        if (cVar15 != '\0') {
          pKVar10 = kctx->stack;
          if (pKVar10->evalty != 0) {
            pcVar17 = (kctx->share->classTable).field_1.bytebuf;
            ty = pKVar10->evalty & 0xfffffff;
            lVar26 = *(long *)(pcVar17 + (ulong)ty * 8);
            if ((*(byte *)(lVar26 + 100) & 2) == 0) {
              ty = (((pKVar10->stack[pKVar10->evalidx].field_0.asObject)->h).ct)->typeId & 0xfffffff
              ;
              lVar26 = *(long *)(pcVar17 + (ulong)ty * 8);
            }
            (**(code **)(lVar26 + 0x28))(kctx,pKVar10->stack + pKVar10->evalidx,0,&local_478);
            fflush(_stdout);
            p_Var11 = kctx->platApi->printf_i;
            pkVar19 = KType_GetString(kctx,ty);
            p_Var12 = ((pkVar19->h).ct)->unbox;
            pkVar19 = KType_GetString(kctx,ty);
            uVar22 = (*p_Var12)(kctx,(kObject_conflict *)pkVar19);
            pcVar17 = (*kctx->klib->KBuffer_text)(kctx,&local_478,1);
            (*p_Var11)("  (%s) %s\n",uVar22,pcVar17);
            pKVar10->evalty = 0;
          }
          (*kctx->klib->KBuffer_Free)(&local_478);
        }
      }
      goto LAB_0010292c;
    }
    (*kctx->klib->KBuffer_Free)(&local_478);
    (*kctx->platApi->printf_i)("\n");
  }
  else {
LAB_0010279d:
    kctx->platApi->exitStatus = 1;
  }
LAB_00102c5c:
  iVar16 = Konoha_Destroy(kctx);
  return iVar16;
}

Assistant:

int main(int argc, char *argv[])
{
	struct KonohaFactory factory = {};
	if(getenv("KONOHA_DEBUG") != NULL) {
		factory.verbose_debug = 1;
		factory.verbose_sugar = 1;
		factory.verbose_code = 1;
	}
	KonohaFactory_SetDefaultFactory(&factory, PosixFactory, argc, argv);
	KonohaContext* konoha = KonohaFactory_CreateKonoha(&factory);
	Konoha_ParseCommandOption(konoha, argc, argv);
	return Konoha_Destroy(konoha);
}